

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTForeFlight.cpp
# Opt level: O0

void __thiscall
ForeFlightSender::SendAtt(ForeFlightSender *this,positionTy *pos,double param_3,double param_4)

{
  bool bVar1;
  reference ppVar2;
  ulong uVar3;
  size_t in_RCX;
  void *__buf;
  positionTy *in_RSI;
  SocketNetworking *in_RDI;
  int in_R8D;
  double dVar4;
  _Rb_tree_iterator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_> *this_00;
  double dVar5;
  pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver> *p;
  iterator __end1;
  iterator __begin1;
  map<XPMP2::SockAddrTy,_XPMP2::UDPReceiver,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>_>
  *__range1;
  char s [200];
  map<XPMP2::SockAddrTy,_XPMP2::UDPReceiver,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>_>
  *this_01;
  _Self local_100;
  _Self local_f8;
  SOCKET *local_f0;
  map<XPMP2::SockAddrTy,_XPMP2::UDPReceiver,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>_>
  local_e8 [4];
  positionTy *local_10;
  
  this_01 = local_e8;
  local_10 = in_RSI;
  dVar4 = positionTy::heading(in_RSI);
  this_00 = (_Rb_tree_iterator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_> *)
            positionTy::pitch(local_10);
  dVar5 = positionTy::roll(local_10);
  snprintf((char *)this_01,200,"XATTLiveTraffic,%.1f,%.1f,%.1f",dVar4,this_00,SUB84(dVar5,0));
  local_f0 = &in_RDI[8].f_socket;
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<XPMP2::SockAddrTy,_XPMP2::UDPReceiver,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>_>
       ::begin(this_01);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<XPMP2::SockAddrTy,_XPMP2::UDPReceiver,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>_>
       ::end(this_01);
  while (bVar1 = std::operator!=(&local_f8,&local_100), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>::
             operator*((_Rb_tree_iterator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_> *
                       )0x1f31e5);
    bVar1 = XPMP2::SocketNetworking::isOpen(&(ppVar2->second).super_SocketNetworking);
    if ((bVar1) &&
       (uVar3 = XPMP2::SocketNetworking::send
                          (&(ppVar2->second).super_SocketNetworking,(int)local_e8,__buf,in_RCX,
                           in_R8D), (uVar3 & 1) == 0)) {
      XPMP2::SocketNetworking::Close(in_RDI);
    }
    std::_Rb_tree_iterator<std::pair<const_XPMP2::SockAddrTy,_XPMP2::UDPReceiver>_>::operator++
              (this_00);
  }
  return;
}

Assistant:

void ForeFlightSender::SendAtt (const positionTy& pos, double /*speed_m*/, double /*track*/)
{
    // format the string to send
    char s[200];
    snprintf(s,sizeof(s),
             "XATTLiveTraffic,%.1f,%.1f,%.1f",
             pos.heading(),                     // heading
             pos.pitch(),                       // pitch
             pos.roll());                       // roll
    
    // send the string to all clients
    for (auto& p: mapUdp)
        if (p.second.isOpen() && !p.second.send(s))
            p.second.Close();
    // (no DebugLogRaw...not at 5Hz!)
}